

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

void __thiscall
google::protobuf::TextFormat::Printer::TextGenerator::Print
          (TextGenerator *this,char *text,size_t size)

{
  char *data;
  long lVar1;
  size_t sVar2;
  
  if (this->indent_level_ < 1) {
    Write(this,text,size);
    if ((size != 0) && (text[size - 1] == '\n')) {
      this->at_start_of_line_ = true;
    }
    return;
  }
  lVar1 = 0;
  do {
    data = text + lVar1;
    sVar2 = 0;
    while( true ) {
      if (size - lVar1 == sVar2) {
        Write(this,data,size - lVar1);
        return;
      }
      if (data[sVar2] == '\n') break;
      sVar2 = sVar2 + 1;
    }
    Write(this,data,sVar2 + 1);
    lVar1 = lVar1 + sVar2 + 1;
    this->at_start_of_line_ = true;
  } while( true );
}

Assistant:

void Print(const char* text, size_t size) override {
    if (indent_level_ > 0) {
      size_t pos = 0;  // The number of bytes we've written so far.
      for (size_t i = 0; i < size; i++) {
        if (text[i] == '\n') {
          // Saw newline.  If there is more text, we may need to insert an
          // indent here.  So, write what we have so far, including the '\n'.
          Write(text + pos, i - pos + 1);
          pos = i + 1;

          // Setting this true will cause the next Write() to insert an indent
          // first.
          at_start_of_line_ = true;
        }
      }
      // Write the rest.
      Write(text + pos, size - pos);
    } else {
      Write(text, size);
      if (size > 0 && text[size - 1] == '\n') {
        at_start_of_line_ = true;
      }
    }
  }